

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

ostream * AixLog::operator<<(ostream *os,Function *function)

{
  bool bVar1;
  long lVar2;
  Function *this;
  Function *in_RSI;
  ostream *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  Log *log;
  Function *in_stack_ffffffffffffffb8;
  
  lVar2 = std::ios::rdbuf();
  if (lVar2 == 0) {
    this = (Function *)0x0;
  }
  else {
    this = (Function *)__dynamic_cast(lVar2,&std::streambuf::typeinfo,&Log::typeinfo,0);
  }
  if (this == (Function *)0x0) {
    bVar1 = Function::operator_cast_to_bool(in_RSI);
    if (bVar1) {
      std::operator<<(in_RDI,(string *)&in_RSI->name);
    }
  }
  else {
    std::lock_guard<std::recursive_mutex>::lock_guard
              ((lock_guard<std::recursive_mutex> *)this,(mutex_type *)in_stack_ffffffffffffffb8);
    Function::operator=(this,in_stack_ffffffffffffffb8);
    std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x2bcf70)
    ;
  }
  return in_RDI;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const Function& function) {
  Log* log = dynamic_cast<Log*>(os.rdbuf());
  if (log != nullptr) {
    std::lock_guard<std::recursive_mutex> lock(log->mutex_);
    log->metadata_.function = function;
  } else if (function) {
    os << function.name;
  }
  return os;
}